

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void pbrt::detail::
     DispatchCPU<pbrt::Camera::InitMetadata(pbrt::ImageMetadata*)const::__0&,void,pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
               (anon_class_8_1_cd19a0ad *func,void *ptr,int index)

{
  int in_EDX;
  anon_class_8_1_cd19a0ad *in_RSI;
  
  if (in_EDX == 0) {
    const::$_0::operator()(in_RSI,(PerspectiveCamera *)0x0);
  }
  else if (in_EDX == 1) {
    const::$_0::operator()(in_RSI,(OrthographicCamera *)0x100000001);
  }
  else if (in_EDX == 2) {
    const::$_0::operator()(in_RSI,(SphericalCamera *)0x200000002);
  }
  else {
    const::$_0::operator()(in_RSI,(RealisticCamera *)CONCAT44(in_EDX,in_EDX));
  }
  return;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 4);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    default:
        return func((const T3 *)ptr);
    }
}